

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O3

DdNode * Extra_bddComputeCube(DdManager *dd,DdNode **bXVars,int nVars)

{
  DdNode *n;
  ulong uVar1;
  DdNode *f;
  
  n = dd->one;
  Cudd_Ref(n);
  if (0 < nVars) {
    uVar1 = 0;
    f = n;
    do {
      n = Cudd_bddAnd(dd,f,bXVars[uVar1]);
      Cudd_Ref(n);
      Cudd_RecursiveDeref(dd,f);
      uVar1 = uVar1 + 1;
      f = n;
    } while ((uint)nVars != uVar1);
  }
  Cudd_Deref(n);
  return n;
}

Assistant:

DdNode * Extra_bddComputeCube( DdManager * dd, DdNode ** bXVars, int nVars )
{
    DdNode * bRes;
    DdNode * bTemp;
    int i;

    bRes = b1; Cudd_Ref( bRes );
    for ( i = 0; i < nVars; i++ )
    {
        bRes = Cudd_bddAnd( dd, bTemp = bRes, bXVars[i] );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
    }

    Cudd_Deref( bRes );
    return bRes;
}